

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamToolsIndex::BamToolsIndex(BamToolsIndex *this,BamReaderPrivate *reader)

{
  (this->super_BamIndex).m_reader = reader;
  (this->super_BamIndex).m_errorString._M_dataplus._M_p =
       (pointer)&(this->super_BamIndex).m_errorString.field_2;
  (this->super_BamIndex).m_errorString._M_string_length = 0;
  (this->super_BamIndex).m_errorString.field_2._M_local_buf[0] = '\0';
  (this->super_BamIndex)._vptr_BamIndex = (_func_int **)&PTR__BamToolsIndex_00171878;
  (this->m_indexFileSummary).
  super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indexFileSummary).
  super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_indexFileSummary).
  super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_blockSize = 1000;
  this->m_inputVersion = 0;
  this->m_outputVersion = BTI_2_0;
  RaiiWrapper::RaiiWrapper(&this->m_resources);
  this->m_isBigEndian = false;
  return;
}

Assistant:

BamToolsIndex::BamToolsIndex(Internal::BamReaderPrivate* reader)
    : BamIndex(reader)
    , m_blockSize(BamToolsIndex::DEFAULT_BLOCK_LENGTH)
    , m_inputVersion(0)
    , m_outputVersion(BTI_2_0) // latest version - used for writing new index files
{
    m_isBigEndian = BamTools::SystemIsBigEndian();
}